

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O1

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_CreateDeviceOrModule
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,
          IOTHUB_REGISTRY_DEVICE_OR_MODULE_CREATE *deviceOrModuleCreateInfo,
          IOTHUB_DEVICE_OR_MODULE *deviceOrModuleInfo)

{
  IOTHUB_REGISTRYMANAGER_AUTH_METHOD IVar1;
  IOTHUB_REGISTRYMANAGER_RESULT IVar2;
  LOGGER_LOG p_Var3;
  ushort **ppuVar4;
  IOTHUB_DEVICE_OR_MODULE *deviceOrModuleInfo_00;
  BUFFER_HANDLE deviceJsonBuffer;
  BUFFER_HANDLE responseBuffer;
  int iVar5;
  char *pcVar6;
  char cVar7;
  char *pcVar8;
  
  if (deviceOrModuleCreateInfo == (IOTHUB_REGISTRY_DEVICE_OR_MODULE_CREATE *)0x0 ||
      deviceOrModuleInfo == (IOTHUB_DEVICE_OR_MODULE *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    pcVar8 = "Input parameter cannot be NULL";
    iVar5 = 0x56d;
LAB_00136cb7:
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
              ,"IoTHubRegistryManager_CreateDeviceOrModule",iVar5,1,pcVar8);
    return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
  }
  memset(deviceOrModuleInfo,0,0xa0);
  deviceOrModuleInfo->connectionState = IOTHUB_DEVICE_CONNECTION_STATE_DISCONNECTED;
  deviceOrModuleInfo->status = IOTHUB_DEVICE_STATUS_DISABLED;
  pcVar8 = deviceOrModuleCreateInfo->deviceId;
  if (pcVar8 == (char *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    pcVar8 = "deviceId cannot be NULL";
    iVar5 = 0x576;
    goto LAB_00136cb7;
  }
  cVar7 = *pcVar8;
  if (cVar7 != '\0') {
    ppuVar4 = __ctype_b_loc();
    pcVar6 = pcVar8;
    do {
      pcVar6 = pcVar6 + 1;
      if ((*(byte *)((long)*ppuVar4 + (long)cVar7 * 2 + 1) & 0x20) != 0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
        }
        pcVar8 = "deviceId cannot contain spaces";
        iVar5 = 0x57b;
        goto LAB_00136cb7;
      }
      cVar7 = *pcVar6;
    } while (cVar7 != '\0');
  }
  IVar1 = deviceOrModuleCreateInfo->authMethod;
  if (IOTHUB_REGISTRYMANAGER_AUTH_NONE < IVar1) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    pcVar8 = "Invalid authorization type specified";
    iVar5 = 0x580;
    goto LAB_00136cb7;
  }
  deviceOrModuleInfo_00 = (IOTHUB_DEVICE_OR_MODULE *)malloc(0xa0);
  if (deviceOrModuleInfo_00 == (IOTHUB_DEVICE_OR_MODULE *)0x0) {
    p_Var3 = xlogging_get_log_function();
    IVar2 = IOTHUB_REGISTRYMANAGER_ERROR;
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_CreateDeviceOrModule",0x588,1,
                "Malloc failed for tempDeviceOrModuleInfo");
    }
    goto LAB_00136da6;
  }
  memset(deviceOrModuleInfo_00,0,0xa0);
  deviceOrModuleInfo_00->deviceId = pcVar8;
  deviceOrModuleInfo_00->moduleId = deviceOrModuleCreateInfo->moduleId;
  deviceOrModuleInfo_00->primaryKey = deviceOrModuleCreateInfo->primaryKey;
  deviceOrModuleInfo_00->secondaryKey = deviceOrModuleCreateInfo->secondaryKey;
  deviceOrModuleInfo_00->authMethod = IVar1;
  deviceOrModuleInfo_00->status = IOTHUB_DEVICE_STATUS_ENABLED;
  deviceOrModuleInfo_00->iotEdge_capable = deviceOrModuleCreateInfo->iotEdge_capable;
  deviceOrModuleInfo_00->managedBy = deviceOrModuleCreateInfo->managedBy;
  deviceJsonBuffer = constructDeviceOrModuleJson(deviceOrModuleInfo_00);
  if (deviceJsonBuffer == (BUFFER_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    IVar2 = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pcVar8 = "Json creation failed";
      iVar5 = 0x59c;
LAB_00136d77:
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_CreateDeviceOrModule",iVar5,1,pcVar8);
    }
LAB_00136d87:
    responseBuffer = (BUFFER_HANDLE)0x0;
  }
  else {
    responseBuffer = BUFFER_new();
    if (responseBuffer == (BUFFER_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      IVar2 = IOTHUB_REGISTRYMANAGER_ERROR;
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar8 = "BUFFER_new failed for responseBuffer";
        iVar5 = 0x5a1;
        goto LAB_00136d77;
      }
      goto LAB_00136d87;
    }
    IVar2 = sendHttpRequestCRUD(registryManagerHandle,IOTHUB_REQUEST_CREATE,
                                deviceOrModuleCreateInfo->deviceId,
                                deviceOrModuleCreateInfo->moduleId,deviceJsonBuffer,0,responseBuffer
                               );
    if (IVar2 == IOTHUB_REGISTRYMANAGER_OK) {
      IVar2 = parseDeviceOrModuleJson(responseBuffer,deviceOrModuleInfo);
    }
    else if (IVar2 == IOTHUB_REGISTRYMANAGER_ERROR) {
      p_Var3 = xlogging_get_log_function();
      IVar2 = IOTHUB_REGISTRYMANAGER_ERROR;
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                  ,"IoTHubRegistryManager_CreateDeviceOrModule",0x5a6,1,
                  "Failure sending HTTP request for create device");
      }
    }
  }
  if (responseBuffer != (BUFFER_HANDLE)0x0) {
    BUFFER_delete(responseBuffer);
  }
  if (deviceJsonBuffer != (BUFFER_HANDLE)0x0) {
    BUFFER_delete(deviceJsonBuffer);
  }
LAB_00136da6:
  free(deviceOrModuleInfo_00);
  return IVar2;
}

Assistant:

static IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_CreateDeviceOrModule(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, const IOTHUB_REGISTRY_DEVICE_OR_MODULE_CREATE* deviceOrModuleCreateInfo, IOTHUB_DEVICE_OR_MODULE* deviceOrModuleInfo)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if ((registryManagerHandle == NULL) || (deviceOrModuleCreateInfo == NULL) || (deviceOrModuleInfo == NULL))
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else
    {
        initializeDeviceOrModuleInfoMembers(deviceOrModuleInfo);

        if (deviceOrModuleCreateInfo->deviceId == NULL)
        {
            LogError("deviceId cannot be NULL");
            result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
        }
        else if ((strHasNoWhitespace(deviceOrModuleCreateInfo->deviceId)) != 0)
        {
            LogError("deviceId cannot contain spaces");
            result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
        }
        else if (isAuthTypeAllowed(deviceOrModuleCreateInfo->authMethod) == false)
        {
            LogError("Invalid authorization type specified");
            result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
        }
        else
        {
            IOTHUB_DEVICE_OR_MODULE* tempDeviceOrModuleInfo;
            if ((tempDeviceOrModuleInfo = malloc(sizeof(IOTHUB_DEVICE_OR_MODULE))) == NULL)
            {
                LogError("Malloc failed for tempDeviceOrModuleInfo");
                result = IOTHUB_REGISTRYMANAGER_ERROR;
            }
            else
            {
                memset(tempDeviceOrModuleInfo, 0, sizeof(*tempDeviceOrModuleInfo));
                tempDeviceOrModuleInfo->deviceId = deviceOrModuleCreateInfo->deviceId;
                tempDeviceOrModuleInfo->moduleId = deviceOrModuleCreateInfo->moduleId;
                tempDeviceOrModuleInfo->primaryKey = deviceOrModuleCreateInfo->primaryKey;
                tempDeviceOrModuleInfo->secondaryKey = deviceOrModuleCreateInfo->secondaryKey;
                tempDeviceOrModuleInfo->authMethod = deviceOrModuleCreateInfo->authMethod;
                tempDeviceOrModuleInfo->status = IOTHUB_DEVICE_STATUS_ENABLED;
                tempDeviceOrModuleInfo->iotEdge_capable = deviceOrModuleCreateInfo->iotEdge_capable;
                tempDeviceOrModuleInfo->managedBy = deviceOrModuleCreateInfo->managedBy;

                BUFFER_HANDLE deviceJsonBuffer = NULL;
                BUFFER_HANDLE responseBuffer = NULL;

                if ((deviceJsonBuffer = constructDeviceOrModuleJson(tempDeviceOrModuleInfo)) == NULL)
                {
                    LogError("Json creation failed");
                    result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
                }
                else if ((responseBuffer = BUFFER_new()) == NULL)
                {
                    LogError("BUFFER_new failed for responseBuffer");
                    result = IOTHUB_REGISTRYMANAGER_ERROR;
                }
                else if ((result = sendHttpRequestCRUD(registryManagerHandle, IOTHUB_REQUEST_CREATE, deviceOrModuleCreateInfo->deviceId, deviceOrModuleCreateInfo->moduleId, deviceJsonBuffer, 0, responseBuffer)) == IOTHUB_REGISTRYMANAGER_ERROR)
                {
                    LogError("Failure sending HTTP request for create device");
                }
                else if (result == IOTHUB_REGISTRYMANAGER_OK)
                {
                    result = parseDeviceOrModuleJson(responseBuffer, deviceOrModuleInfo);
                }
                else
                {
                }

                if (responseBuffer != NULL)
                {
                    BUFFER_delete(responseBuffer);
                }
                if (deviceJsonBuffer != NULL)
                {
                    BUFFER_delete(deviceJsonBuffer);
                }
            }
            free(tempDeviceOrModuleInfo);
        }
    }
    return result;
}